

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O0

nbt_status dump_string_binary(char *name,buffer *b)

{
  int iVar1;
  undefined2 local_2a;
  size_t sStack_28;
  int16_t dumped_len;
  size_t len;
  buffer *b_local;
  char *name_local;
  
  len = (size_t)b;
  b_local = (buffer *)name;
  if (name != (char *)0x0) {
    sStack_28 = strlen(name);
    if (sStack_28 < 0x8000) {
      local_2a = (undefined2)sStack_28;
      be2ne(&local_2a,2);
      iVar1 = buffer_append((buffer *)len,&local_2a,2);
      if (iVar1 == 0) {
        iVar1 = buffer_append((buffer *)len,b_local,sStack_28);
        if (iVar1 == 0) {
          name_local._4_4_ = NBT_OK;
        }
        else {
          name_local._4_4_ = NBT_EMEM;
        }
      }
      else {
        name_local._4_4_ = NBT_EMEM;
      }
    }
    else {
      name_local._4_4_ = NBT_ERR;
    }
    return name_local._4_4_;
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_parsing.c",
                0x2b1,"nbt_status dump_string_binary(const char *, struct buffer *)");
}

Assistant:

static nbt_status dump_string_binary(const char* name, struct buffer* b)
{
    assert(name);

    size_t len = strlen(name);

    if(len > 32767 /* SHORT_MAX */)
        return NBT_ERR;

    { /* dump the length */
        int16_t dumped_len = (int16_t)len;
        ne2be(&dumped_len, sizeof dumped_len);

        CHECKED_APPEND(b, &dumped_len, sizeof dumped_len);
    }

    CHECKED_APPEND(b, name, len);

    return NBT_OK;
}